

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O1

int h262_mb_addr_inc(bitstream *str,uint32_t *val)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint32_t tmp_1;
  uint32_t tmp;
  uint32_t c33;
  uint local_2c;
  uint32_t local_28 [2];
  
  if (str->dir == VS_ENCODE) {
    local_2c = *val;
    local_28[1] = 0x21;
    if (0x20 < local_2c) {
      do {
        iVar1 = vs_vlc(str,local_28 + 1,mbai_vlc);
        if (iVar1 != 0) goto LAB_0010437f;
        local_2c = local_2c - 0x21;
      } while (0x20 < local_2c);
    }
    iVar1 = vs_vlc(str,&local_2c,mbai_vlc);
    iVar2 = 1;
    if (iVar1 == 0) {
LAB_001043e7:
      iVar2 = 0;
    }
  }
  else {
    *val = 0;
    iVar1 = vs_vlc(str,local_28,mbai_vlc);
    bVar3 = iVar1 == 0;
    if (bVar3) {
      do {
        if (local_28[0] != 0x22) {
          if (local_28[0] != 0x21) {
            *val = *val + local_28[0];
            if (!bVar3) {
              return 1;
            }
            goto LAB_001043e7;
          }
          *val = *val + 0x21;
        }
        iVar1 = vs_vlc(str,local_28,mbai_vlc);
        bVar3 = iVar1 == 0;
      } while (bVar3);
    }
LAB_0010437f:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int h262_mb_addr_inc(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		uint32_t tmp = *val, c33 = 33;
		while (tmp > 32) {
			if (vs_vlc(str, &c33, mbai_vlc)) return 1;
			tmp -= 33;
		}
		if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
	} else {
		*val = 0;
		uint32_t tmp;
		while (1) {
			if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
			if (tmp == 33) {
				*val += 33;
			} else if (tmp == 34) {
				/* stuffing */
			} else {
				*val += tmp;
				break;
			}
		}
	}
	return 0;
}